

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::EventContext::AddDebugAnnotation<unsigned_int_const&>
          (EventContext *this,char *name,uint *value)

{
  TracedValue local_40;
  DebugAnnotation *local_28;
  DebugAnnotation *annotation;
  uint *value_local;
  char *name_local;
  EventContext *this_local;
  
  if ((this->tls_state_ == (TrackEventTlsState *)0x0) ||
     ((this->tls_state_->filter_debug_annotations & 1U) == 0)) {
    annotation = (DebugAnnotation *)value;
    value_local = (uint *)name;
    name_local = (char *)this;
    local_28 = AddDebugAnnotation(this,name);
    internal::CreateTracedValueFromProto(&local_40,local_28,this);
    WriteIntoTracedValue<unsigned_int_const&>(&local_40,(uint *)annotation);
    TracedValue::~TracedValue(&local_40);
  }
  return;
}

Assistant:

void AddDebugAnnotation(const char* name, T&& value) {
    if (tls_state_ && tls_state_->filter_debug_annotations)
      return;
    auto annotation = AddDebugAnnotation(name);
    WriteIntoTracedValue(internal::CreateTracedValueFromProto(annotation, this),
                         std::forward<T>(value));
  }